

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O0

void __thiscall fasttext::Args::parseArgs(Args *this,int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  ulong uVar5;
  long in_RDX;
  int in_ESI;
  string *in_RDI;
  double dVar6;
  int ai;
  string command;
  char *in_stack_fffffffffffffcf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd00;
  allocator *in_stack_fffffffffffffd68;
  Args *in_stack_fffffffffffffd70;
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [32];
  string local_1b0 [39];
  allocator local_189;
  string local_188 [39];
  allocator local_161;
  string local_160 [32];
  Args *in_stack_fffffffffffffec0;
  string local_138 [39];
  allocator local_111;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [32];
  int local_50;
  allocator local_39;
  string local_38 [32];
  long local_18;
  int local_c;
  
  pcVar1 = *(char **)(in_RDX + 8);
  local_18 = in_RDX;
  local_c = in_ESI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,pcVar1,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  bVar2 = std::operator==(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  if (bVar2) {
    *(undefined4 *)(in_RDI + 0x130) = 3;
    *(undefined4 *)(in_RDI + 300) = 3;
    *(undefined4 *)(in_RDI + 0x118) = 1;
    *(undefined8 *)(in_RDI + 0x100) = 0x3fb999999999999a;
  }
  else {
    bVar2 = std::operator==(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    if (bVar2) {
      *(undefined4 *)(in_RDI + 0x130) = 1;
    }
  }
  local_50 = 2;
  while( true ) {
    if (local_c <= local_50) {
      uVar5 = std::__cxx11::string::empty();
      if (((uVar5 & 1) == 0) && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) {
        std::__cxx11::string::~string(local_38);
        return;
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"Empty input or output path.");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      printHelp(in_stack_fffffffffffffec0);
      exit(1);
    }
    if (**(char **)(local_18 + (long)local_50 * 8) != '-') {
      poVar4 = std::operator<<((ostream *)&std::cout,"Provided argument without a dash! Usage:");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      printHelp(in_stack_fffffffffffffec0);
      exit(1);
    }
    iVar3 = strcmp(*(char **)(local_18 + (long)local_50 * 8),"-h");
    if (iVar3 == 0) break;
    iVar3 = strcmp(*(char **)(local_18 + (long)local_50 * 8),"-input");
    if (iVar3 == 0) {
      pcVar1 = *(char **)(local_18 + 8 + (long)local_50 * 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,pcVar1,&local_71);
      std::__cxx11::string::operator=(in_RDI,local_70);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
    }
    else {
      iVar3 = strcmp(*(char **)(local_18 + (long)local_50 * 8),"-test");
      if (iVar3 == 0) {
        pcVar1 = *(char **)(local_18 + 8 + (long)local_50 * 8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_98,pcVar1,&local_99);
        std::__cxx11::string::operator=(in_RDI + 0x20,local_98);
        std::__cxx11::string::~string(local_98);
        std::allocator<char>::~allocator((allocator<char> *)&local_99);
      }
      else {
        iVar3 = strcmp(*(char **)(local_18 + (long)local_50 * 8),"-output");
        if (iVar3 == 0) {
          pcVar1 = *(char **)(local_18 + 8 + (long)local_50 * 8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_c0,pcVar1,&local_c1);
          std::__cxx11::string::operator=(in_RDI + 0x40,local_c0);
          std::__cxx11::string::~string(local_c0);
          std::allocator<char>::~allocator((allocator<char> *)&local_c1);
        }
        else {
          iVar3 = strcmp(*(char **)(local_18 + (long)local_50 * 8),"-suboutput");
          if (iVar3 == 0) {
            pcVar1 = *(char **)(local_18 + 8 + (long)local_50 * 8);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_e8,pcVar1,&local_e9);
            std::__cxx11::string::operator=(in_RDI + 0x60,local_e8);
            std::__cxx11::string::~string(local_e8);
            std::allocator<char>::~allocator((allocator<char> *)&local_e9);
          }
          else {
            iVar3 = strcmp(*(char **)(local_18 + (long)local_50 * 8),"-lemmaoutput");
            if (iVar3 == 0) {
              pcVar1 = *(char **)(local_18 + 8 + (long)local_50 * 8);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_110,pcVar1,&local_111);
              std::__cxx11::string::operator=(in_RDI + 0x80,local_110);
              std::__cxx11::string::~string(local_110);
              std::allocator<char>::~allocator((allocator<char> *)&local_111);
            }
            else {
              iVar3 = strcmp(*(char **)(local_18 + (long)local_50 * 8),"-morphoutput");
              if (iVar3 == 0) {
                in_stack_fffffffffffffd70 = *(Args **)(local_18 + 8 + (long)local_50 * 8);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_138,(char *)in_stack_fffffffffffffd70,
                           (allocator *)&stack0xfffffffffffffec7);
                std::__cxx11::string::operator=(in_RDI + 0xa0,local_138);
                std::__cxx11::string::~string(local_138);
                std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffec7);
              }
              else {
                iVar3 = strcmp(*(char **)(local_18 + (long)local_50 * 8),"-ipaoutput");
                if (iVar3 == 0) {
                  pcVar1 = *(char **)(local_18 + 8 + (long)local_50 * 8);
                  in_stack_fffffffffffffd68 = &local_161;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_160,pcVar1,in_stack_fffffffffffffd68);
                  std::__cxx11::string::operator=(in_RDI + 0xc0,local_160);
                  std::__cxx11::string::~string(local_160);
                  std::allocator<char>::~allocator((allocator<char> *)&local_161);
                }
                else {
                  iVar3 = strcmp(*(char **)(local_18 + (long)local_50 * 8),"-props");
                  if (iVar3 == 0) {
                    pcVar1 = *(char **)(local_18 + 8 + (long)local_50 * 8);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_188,pcVar1,&local_189);
                    std::__cxx11::string::operator=(in_RDI + 0xe0,local_188);
                    std::__cxx11::string::~string(local_188);
                    std::allocator<char>::~allocator((allocator<char> *)&local_189);
                    std::__cxx11::string::string(local_1b0,in_RDI + 0xe0);
                    initProps(in_stack_fffffffffffffd70,(string *)in_stack_fffffffffffffd68);
                    std::__cxx11::string::~string(local_1b0);
                  }
                  else {
                    iVar3 = strcmp(*(char **)(local_18 + (long)local_50 * 8),"-lr");
                    if (iVar3 == 0) {
                      dVar6 = atof(*(char **)(local_18 + (long)(local_50 + 1) * 8));
                      *(double *)(in_RDI + 0x100) = dVar6;
                    }
                    else {
                      iVar3 = strcmp(*(char **)(local_18 + (long)local_50 * 8),"-lrUpdateRate");
                      if (iVar3 == 0) {
                        iVar3 = atoi(*(char **)(local_18 + (long)(local_50 + 1) * 8));
                        *(int *)(in_RDI + 0x108) = iVar3;
                      }
                      else {
                        iVar3 = strcmp(*(char **)(local_18 + (long)local_50 * 8),"-dim");
                        if (iVar3 == 0) {
                          iVar3 = atoi(*(char **)(local_18 + (long)(local_50 + 1) * 8));
                          *(int *)(in_RDI + 0x10c) = iVar3;
                        }
                        else {
                          iVar3 = strcmp(*(char **)(local_18 + (long)local_50 * 8),"-ws");
                          if (iVar3 == 0) {
                            iVar3 = atoi(*(char **)(local_18 + (long)(local_50 + 1) * 8));
                            *(int *)(in_RDI + 0x110) = iVar3;
                          }
                          else {
                            iVar3 = strcmp(*(char **)(local_18 + (long)local_50 * 8),"-epoch");
                            if (iVar3 == 0) {
                              iVar3 = atoi(*(char **)(local_18 + (long)(local_50 + 1) * 8));
                              *(int *)(in_RDI + 0x114) = iVar3;
                            }
                            else {
                              iVar3 = strcmp(*(char **)(local_18 + (long)local_50 * 8),"-minCount");
                              if (iVar3 == 0) {
                                iVar3 = atoi(*(char **)(local_18 + (long)(local_50 + 1) * 8));
                                *(int *)(in_RDI + 0x118) = iVar3;
                              }
                              else {
                                iVar3 = strcmp(*(char **)(local_18 + (long)local_50 * 8),"-neg");
                                if (iVar3 == 0) {
                                  iVar3 = atoi(*(char **)(local_18 + (long)(local_50 + 1) * 8));
                                  *(int *)(in_RDI + 0x11c) = iVar3;
                                }
                                else {
                                  iVar3 = strcmp(*(char **)(local_18 + (long)local_50 * 8),"-minn");
                                  if (iVar3 == 0) {
                                    iVar3 = atoi(*(char **)(local_18 + (long)(local_50 + 1) * 8));
                                    *(int *)(in_RDI + 0x120) = iVar3;
                                  }
                                  else {
                                    iVar3 = strcmp(*(char **)(local_18 + (long)local_50 * 8),"-maxn"
                                                  );
                                    if (iVar3 == 0) {
                                      iVar3 = atoi(*(char **)(local_18 + (long)(local_50 + 1) * 8));
                                      *(int *)(in_RDI + 0x124) = iVar3;
                                    }
                                    else {
                                      iVar3 = strcmp(*(char **)(local_18 + (long)local_50 * 8),
                                                     "-wordNgrams");
                                      if (iVar3 == 0) {
                                        iVar3 = atoi(*(char **)(local_18 + (long)(local_50 + 1) * 8)
                                                    );
                                        *(int *)(in_RDI + 0x128) = iVar3;
                                      }
                                      else {
                                        iVar3 = strcmp(*(char **)(local_18 + (long)local_50 * 8),
                                                       "-loss");
                                        if (iVar3 == 0) {
                                          iVar3 = strcmp(*(char **)(local_18 +
                                                                   (long)(local_50 + 1) * 8),"hs");
                                          if (iVar3 == 0) {
                                            *(undefined4 *)(in_RDI + 300) = 1;
                                          }
                                          else {
                                            iVar3 = strcmp(*(char **)(local_18 +
                                                                     (long)(local_50 + 1) * 8),"ns")
                                            ;
                                            if (iVar3 == 0) {
                                              *(undefined4 *)(in_RDI + 300) = 2;
                                            }
                                            else {
                                              iVar3 = strcmp(*(char **)(local_18 +
                                                                       (long)(local_50 + 1) * 8),
                                                             "softmax");
                                              if (iVar3 != 0) {
                                                poVar4 = std::operator<<((ostream *)&std::cout,
                                                                         "Unknown loss: ");
                                                poVar4 = std::operator<<(poVar4,*(char **)(local_18 
                                                  + 8 + (long)local_50 * 8));
                                                std::ostream::operator<<
                                                          (poVar4,std::
                                                  endl<char,std::char_traits<char>>);
                                                printHelp(in_stack_fffffffffffffec0);
                                                exit(1);
                                              }
                                              *(undefined4 *)(in_RDI + 300) = 3;
                                            }
                                          }
                                        }
                                        else {
                                          iVar3 = strcmp(*(char **)(local_18 + (long)local_50 * 8),
                                                         "-bucket");
                                          if (iVar3 == 0) {
                                            iVar3 = atoi(*(char **)(local_18 +
                                                                   (long)(local_50 + 1) * 8));
                                            *(int *)(in_RDI + 0x134) = iVar3;
                                          }
                                          else {
                                            iVar3 = strcmp(*(char **)(local_18 + (long)local_50 * 8)
                                                           ,"-thread");
                                            if (iVar3 == 0) {
                                              iVar3 = atoi(*(char **)(local_18 +
                                                                     (long)(local_50 + 1) * 8));
                                              *(int *)(in_RDI + 0x138) = iVar3;
                                            }
                                            else {
                                              iVar3 = strcmp(*(char **)(local_18 +
                                                                       (long)local_50 * 8),"-t");
                                              if (iVar3 == 0) {
                                                dVar6 = atof(*(char **)(local_18 +
                                                                       (long)(local_50 + 1) * 8));
                                                *(double *)(in_RDI + 0x140) = dVar6;
                                              }
                                              else {
                                                iVar3 = strcmp(*(char **)(local_18 +
                                                                         (long)local_50 * 8),
                                                               "-label");
                                                if (iVar3 == 0) {
                                                  pcVar1 = *(char **)(local_18 + 8 +
                                                                     (long)local_50 * 8);
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string
                                                            (local_1d0,pcVar1,&local_1d1);
                                                  std::__cxx11::string::operator=
                                                            (in_RDI + 0x148,local_1d0);
                                                  std::__cxx11::string::~string(local_1d0);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_1d1);
                                                }
                                                else {
                                                  iVar3 = strcmp(*(char **)(local_18 +
                                                                           (long)local_50 * 8),
                                                                 "-verbose");
                                                  if (iVar3 == 0) {
                                                    iVar3 = atoi(*(char **)(local_18 +
                                                                           (long)(local_50 + 1) * 8)
                                                                );
                                                    *(int *)(in_RDI + 0x168) = iVar3;
                                                  }
                                                  else {
                                                    iVar3 = strcmp(*(char **)(local_18 +
                                                                             (long)local_50 * 8),
                                                                   "-pretrainedVectors");
                                                    if (iVar3 != 0) {
                                                      poVar4 = std::operator<<((ostream *)&std::cout
                                                                               ,"Unknown argument: "
                                                                              );
                                                      poVar4 = std::operator<<(poVar4,*(char **)(
                                                  local_18 + (long)local_50 * 8));
                                                  std::ostream::operator<<
                                                            (poVar4,std::
                                                  endl<char,std::char_traits<char>>);
                                                  printHelp(in_stack_fffffffffffffec0);
                                                  exit(1);
                                                  }
                                                  pcVar1 = *(char **)(local_18 + 8 +
                                                                     (long)local_50 * 8);
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string
                                                            (local_1f8,pcVar1,&local_1f9);
                                                  std::__cxx11::string::operator=
                                                            (in_RDI + 0x170,local_1f8);
                                                  std::__cxx11::string::~string(local_1f8);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_1f9);
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    local_50 = local_50 + 2;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Here is the help! Usage:");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  printHelp(in_stack_fffffffffffffec0);
  exit(1);
}

Assistant:

void Args::parseArgs(int argc, char** argv) {
  std::string command(argv[1]);
  if (command == "supervised") {
    model = model_name::sup;
    loss = loss_name::softmax;
    minCount = 1;
    lr = 0.1;
  } else if (command == "cbow") {
    model = model_name::cbow;
  }
  int ai = 2;
  while (ai < argc) {
    if (argv[ai][0] != '-') {
      std::cout << "Provided argument without a dash! Usage:" << std::endl;
      printHelp();
      exit(EXIT_FAILURE);
    }
    if (strcmp(argv[ai], "-h") == 0) {
      std::cout << "Here is the help! Usage:" << std::endl;
      printHelp();
      exit(EXIT_FAILURE);
    } else if (strcmp(argv[ai], "-input") == 0) {
      input = std::string(argv[ai + 1]); 
	} else if (strcmp(argv[ai], "-test") == 0) {
      test = std::string(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-output") == 0) {
      output = std::string(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-suboutput") == 0) {
      suboutput = std::string(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-lemmaoutput") == 0) {
      lemmaoutput = std::string(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-morphoutput") == 0) {
      morphoutput = std::string(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-ipaoutput") == 0) {
      ipaoutput = std::string(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-props") == 0) {
      propsStr = std::string(argv[ai + 1]);
      initProps(propsStr);
    } else if (strcmp(argv[ai], "-lr") == 0) {
      lr = atof(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-lrUpdateRate") == 0) {
      lrUpdateRate = atoi(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-dim") == 0) {
      dim = atoi(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-ws") == 0) {
      ws = atoi(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-epoch") == 0) {
      epoch = atoi(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-minCount") == 0) {
      minCount = atoi(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-neg") == 0) {
      neg = atoi(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-minn") == 0) {
          minn = atoi(argv[ai + 1]);
    } else if (strcmp(argv[ai],"-maxn") == 0) {
          maxn = atoi(argv[ai + 1]);
    }else if (strcmp(argv[ai], "-wordNgrams") == 0) {
      wordNgrams = atoi(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-loss") == 0) {
      if (strcmp(argv[ai + 1], "hs") == 0) {
        loss = loss_name::hs;
      } else if (strcmp(argv[ai + 1], "ns") == 0) {
        loss = loss_name::ns;
      } else if (strcmp(argv[ai + 1], "softmax") == 0) {
        loss = loss_name::softmax;
      } else {
        std::cout << "Unknown loss: " << argv[ai + 1] << std::endl;
        printHelp();
        exit(EXIT_FAILURE);
      }
    } else if (strcmp(argv[ai], "-bucket") == 0) {
      bucket = atoi(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-thread") == 0) {
      thread = atoi(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-t") == 0) {
      t = atof(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-label") == 0) {
      label = std::string(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-verbose") == 0) {
      verbose = atoi(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-pretrainedVectors") == 0) {
      pretrainedVectors = std::string(argv[ai + 1]);
    } else {
      std::cout << "Unknown argument: " << argv[ai] << std::endl;
      printHelp();
      exit(EXIT_FAILURE);
    }
    ai += 2;
  }
  if (input.empty() || output.empty()) {
    std::cout << "Empty input or output path." << std::endl;
    printHelp();
    exit(EXIT_FAILURE);
  }
}